

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O1

void __thiscall covenant::DFA<covenant::Sym>::nondet_union(DFA<covenant::Sym> *this,dfa_t *other)

{
  State SVar1;
  State r;
  pointer pvVar2;
  pointer pvVar3;
  DFA<covenant::Sym> *pDVar4;
  bool bVar5;
  uint uVar6;
  State s;
  undefined1 *puVar7;
  string *psVar8;
  ulong uVar9;
  ulong *puVar10;
  socklen_t *__addr_len;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  emplace_return eVar14;
  MapStates mapping;
  ulong local_98;
  DFA<covenant::Sym> *local_90;
  uint local_84;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  local_80;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  if ((((other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_start.super__Bit_iterator_base._M_p !=
        (other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_finish.super__Bit_iterator_base._M_p) ||
      ((other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset != 0)) &&
     (((other->trans).
       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (other->trans).
       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ||
      ((other->eps).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (other->eps).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)))) {
    local_80.super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>.current_ =
         '\0';
    uVar9 = 0x26;
    puVar7 = boost::unordered::detail::prime_list_template<unsigned_long>::value;
    do {
      uVar11 = uVar9 >> 1;
      uVar13 = ~uVar11 + uVar9;
      uVar9 = uVar11;
      if (*(ulong *)((long)puVar7 + uVar11 * 8) < 0xb) {
        puVar7 = (undefined1 *)((ulong *)((long)puVar7 + uVar11 * 8) + 1);
        uVar9 = uVar13;
      }
    } while (0 < (long)uVar9);
    puVar10 = (ulong *)(boost::unordered::detail::prime_list_template<unsigned_long>::value + 0x128)
    ;
    if (puVar7 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
      puVar10 = (ulong *)puVar7;
    }
    local_80.bucket_count_ = *puVar10;
    local_80.size_ = 0;
    local_80.mlf_ = 1.0;
    local_80.max_load_ = 0;
    local_80.buckets_ = (bucket_pointer)0x0;
    local_90 = this;
    if (0 < (int)((ulong)((long)(other->trans).
                                super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(other->trans).
                               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
      uVar11 = ((long)(this->trans).
                      super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->trans).
                      super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar12 = 0;
      uVar9 = uVar11 & 0xffffffff;
      do {
        local_98 = (uVar9 << 0x20) + lVar12;
        boost::unordered::detail::
        table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
        ::emplace_unique<std::pair<int,unsigned_int>>
                  ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                    *)&local_80,&local_98);
        state(local_90,(int)uVar11 + (int)lVar12);
        uVar9 = (ulong)((int)uVar9 + 1);
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)((ulong)((long)(other->trans).
                                            super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(other->trans).
                                           super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x55555555);
    }
    local_98 = local_98 & 0xffffffff00000000;
    if ((other->trans).
        super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (other->trans).
        super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pvVar2 = (other->trans).
                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar2[local_98 & 0xffffffff].
                     super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                     ._M_impl.super__Vector_impl_data + 8) !=
            pvVar2[local_98 & 0xffffffff].
            super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar9 = 0;
          uVar11 = 1;
          do {
            eVar14 = boost::unordered::detail::
                     table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                     ::try_emplace_unique<unsigned_int_const&>
                               ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                 *)&local_80,(uint *)&local_98);
            SVar1.id = *(uint *)((long)&((eVar14.first.node_.node_)->value_base_).data_.data_ + 4);
            lVar12 = *(long *)&(other->trans).
                               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_98 & 0xffffffff].
                               super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                               ._M_impl.super__Vector_impl_data;
            eVar14 = boost::unordered::detail::
                     table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                     ::try_emplace_unique<unsigned_int_const&>
                               ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                 *)&local_80,(uint *)(lVar12 + uVar9 * 8 + 4));
            transition(local_90,SVar1,(Sym *)(lVar12 + uVar9 * 8),
                       (State)*(uint *)((long)&((eVar14.first.node_.node_)->value_base_).data_.data_
                                       + 4));
            pvVar2 = (other->trans).
                     super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar5 = uVar11 < (ulong)((long)*(pointer *)
                                            ((long)&pvVar2[local_98 & 0xffffffff].
                                                                                                        
                                                  super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                     *(long *)&pvVar2[local_98 & 0xffffffff].
                                               super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                               ._M_impl.super__Vector_impl_data >> 3);
            uVar9 = uVar11;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (bVar5);
        }
        pDVar4 = local_90;
        pvVar3 = (other->eps).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar3[local_98 & 0xffffffff].super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data + 8) !=
            pvVar3[local_98 & 0xffffffff].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar9 = 0;
          uVar11 = 1;
          do {
            eVar14 = boost::unordered::detail::
                     table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                     ::try_emplace_unique<unsigned_int_const&>
                               ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                 *)&local_80,(uint *)&local_98);
            SVar1.id = *(uint *)((long)&((eVar14.first.node_.node_)->value_base_).data_.data_ + 4);
            local_84 = *(uint *)(*(long *)&(other->eps).
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [local_98 & 0xffffffff].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data + uVar9 * 4);
            eVar14 = boost::unordered::detail::
                     table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                     ::try_emplace_unique<unsigned_int>(&local_80,&local_84);
            eps_transition(pDVar4,SVar1,
                           (State)*(uint *)((long)&((eVar14.first.node_.node_)->value_base_).data_.
                                                   data_ + 4));
            pvVar3 = (other->eps).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar5 = uVar11 < (ulong)((long)*(pointer *)
                                            ((long)&pvVar3[local_98 & 0xffffffff].
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data + 8) -
                                     *(long *)&pvVar3[local_98 & 0xffffffff].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data >> 2);
            uVar9 = uVar11;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (bVar5);
        }
        uVar6 = (int)local_98 + 1;
        local_98 = CONCAT44(local_98._4_4_,uVar6);
        uVar9 = ((long)(other->trans).
                       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(other->trans).
                       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar6 <= uVar9 && uVar9 - uVar6 != 0);
    }
    if (0 < (int)((ulong)((long)(other->trans).
                                super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(other->trans).
                               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
      uVar9 = 0;
      do {
        __addr_len = (socklen_t *)(uVar9 >> 6);
        if (((other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[(long)__addr_len] >>
             (uVar9 & 0x3f) & 1) != 0) {
          local_98 = CONCAT44(local_98._4_4_,(int)uVar9);
          eVar14 = boost::unordered::detail::
                   table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                   ::try_emplace_unique<unsigned_int>(&local_80,(uint *)&local_98);
          accept(local_90,*(int *)((long)&((eVar14.first.node_.node_)->value_base_).data_.data_ + 4)
                 ,eVar14._8_8_,__addr_len);
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 <
               (long)((int)((ulong)((long)(other->trans).
                                          super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(other->trans).
                                         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555));
    }
    pDVar4 = local_90;
    s = state(local_90,(int)((ulong)((long)(local_90->trans).
                                           super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_90->trans).
                                          super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x55555555);
    SVar1.id = pDVar4->start;
    local_98 = CONCAT44(local_98._4_4_,other->start);
    eVar14 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
             ::try_emplace_unique<unsigned_int>(&local_80,(uint *)&local_98);
    r.id = *(uint *)((long)&((eVar14.first.node_.node_)->value_base_).data_.data_ + 4);
    eps_transition(pDVar4,s,SVar1);
    eps_transition(pDVar4,s,r);
    pDVar4->start = s.id;
    eps_elim(pDVar4);
    bVar5 = eliminateDeadStates(pDVar4);
    if (!bVar5) {
      psVar8 = (string *)__cxa_allocate_exception(0x20);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"nondet union of DFA\'s returned an empty automata","");
      *(string **)psVar8 = psVar8 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar8,local_50,local_50 + local_48);
      __cxa_throw(psVar8,&error::typeinfo,error::~error);
    }
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
    ::~table(&local_80);
  }
  return;
}

Assistant:

void nondet_union(const dfa_t &other)
    { 
      
      if (other.accepts.empty()) 
        return;
      if (other.trans.empty() && other.eps.empty()) 
        return;
      
      MapStates mapping; // mapping to relabel states old -> new
      
      unsigned int nstates = (unsigned int) this->nStates();
      for(int i=0; i< other.nStates(); i++)
      {
        mapping.insert(make_pair(i, nstates));
        this->state(nstates++);
      }
      
      for( unsigned int ss = 0; ss < other.trans.size(); ss++ )
      {
        for( unsigned int ti = 0; ti < other.trans[ss].size(); ti++ )
        {
          this->transition(mkState(mapping[ss]), 
                           other.trans[ss][ti].val,
                           mkState(mapping[other.trans[ss][ti].dest]));
        }
        for(unsigned int ei = 0; ei < other.eps[ss].size(); ei++)
        {
          this->eps_transition(mkState(mapping[ss]), 
                               mkState(mapping[other.eps[ss][ei]])); 
        }
      }
      
      // set new accepting states
      for (int i=0; i < other.nStates() ; i++)
      {
        if (other.accepts[i])
          this->accept(mkState(mapping[i]));
      }
      
      // finally, set new initial state
      State new_start       = this->state(this->nStates());
      State old_start_ndfa  = this->startState();
      State old_start_other = mkState(mapping[other.startState().id]);
      this->eps_transition(new_start, old_start_ndfa);
      this->eps_transition(new_start, old_start_other);
      this->setStart(new_start);
      // Make sure no epsilon transitions after union
      this->eps_elim();    
      bool is_not_empty = this->eliminateDeadStates();
      if (!is_not_empty)
        throw error("nondet union of DFA's returned an empty automata");
    }